

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

int __thiscall llvm::raw_fd_ostream::close(raw_fd_ostream *this,int __fd)

{
  if (this->ShouldClose != false) {
    this->ShouldClose = false;
    raw_ostream::flush((raw_ostream *)this);
    llvm_unreachable_internal
              ("close",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
               ,0x23f);
  }
  __assert_fail("ShouldClose",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                ,0x23c,"void llvm::raw_fd_ostream::close()");
}

Assistant:

void raw_fd_ostream::close() {
  assert(ShouldClose);
  ShouldClose = false;
  flush();
  llvm_unreachable("close"); // XXX BINARYEN
#if 0
  if (auto EC = sys::Process::SafelyCloseFileDescriptor(FD))
    error_detected(EC);
#endif
  FD = -1;
}